

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_get_index_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,int lastpos)

{
  stack_st_X509_NAME_ENTRY *sk_00;
  int iVar1;
  size_t sVar2;
  X509_NAME_ENTRY *pXVar3;
  X509_NAME_ENTRY *ne;
  int n;
  stack_st_X509_NAME_ENTRY *sk;
  int lastpos_local;
  ASN1_OBJECT *obj_local;
  X509_NAME *name_local;
  
  if (name == (X509_NAME *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    sk._4_4_ = lastpos;
    if (lastpos < 0) {
      sk._4_4_ = -1;
    }
    sk_00 = (stack_st_X509_NAME_ENTRY *)name->entries;
    sVar2 = sk_X509_NAME_ENTRY_num(sk_00);
    do {
      sk._4_4_ = sk._4_4_ + 1;
      if ((int)sVar2 <= sk._4_4_) {
        return -1;
      }
      pXVar3 = sk_X509_NAME_ENTRY_value(sk_00,(long)sk._4_4_);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)pXVar3->object,obj);
    } while (iVar1 != 0);
    name_local._4_4_ = sk._4_4_;
  }
  return name_local._4_4_;
}

Assistant:

int X509_NAME_get_index_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                               int lastpos) {
  if (name == NULL) {
    return -1;
  }
  if (lastpos < 0) {
    lastpos = -1;
  }
  const STACK_OF(X509_NAME_ENTRY) *sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  for (lastpos++; lastpos < n; lastpos++) {
    const X509_NAME_ENTRY *ne = sk_X509_NAME_ENTRY_value(sk, lastpos);
    if (OBJ_cmp(ne->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}